

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

void __thiscall vkt::ssbo::BufferBlock::BufferBlock(BufferBlock *this,char *blockName)

{
  allocator<char> local_19;
  char *local_18;
  char *blockName_local;
  BufferBlock *this_local;
  
  local_18 = blockName;
  blockName_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,blockName,&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::__cxx11::string::string((string *)&this->m_instanceName);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::vector
            (&this->m_variables);
  this->m_arraySize = -1;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_lastUnsizedArraySizes);
  this->m_flags = 0;
  setArraySize(this,0);
  return;
}

Assistant:

BufferBlock::BufferBlock (const char* blockName)
	: m_blockName	(blockName)
	, m_arraySize	(-1)
	, m_flags		(0)
{
	setArraySize(0);
}